

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O0

void __thiscall QFunctionJAOHTree::ComputeQ(QFunctionJAOHTree *this)

{
  long lVar1;
  undefined8 uVar2;
  PlanningUnit *this_00;
  size_t sVar3;
  long *plVar4;
  size_t sVar5;
  long *in_RDI;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double v;
  BGIP_SolverBruteForceSearch<JointPolicyPureVector> bgs;
  double Q;
  double exp_fut_R;
  Index sI;
  double exp_imm_R;
  Index newJAI;
  size_t empty_jaohI;
  BGIP_sharedPtr bg_time_step;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  bool last_t;
  JointBeliefInterface *b0;
  JointBeliefInterface *b0p;
  size_t time_step;
  size_type in_stack_fffffffffffffd18;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffd20;
  allocator_type *in_stack_fffffffffffffd28;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> *nrDesiredSolutions;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffd30;
  BayesianGameIdenticalPayoff *in_stack_fffffffffffffd38;
  BGIP_SolverBruteForceSearch<JointPolicyPureVector> *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  E *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  Index i;
  BayesianGameBase *in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffe27;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  BayesianGameIdenticalPayoff *in_stack_fffffffffffffe40;
  ulong local_98;
  uint local_8c;
  ulong local_88;
  uint local_7c;
  shared_ptr<BayesianGameIdenticalPayoff> local_70;
  undefined8 local_58;
  byte local_31;
  JointBeliefInterface *local_30;
  JointBeliefInterface *local_28;
  long local_20;
  
  i = (Index)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  lVar1 = (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                    ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  if (lVar1 == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  local_20 = 0;
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
            ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  local_30 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(in_stack_fffffffffffffd30);
  local_31 = 0;
  sVar5 = local_20 + 1;
  local_28 = local_30;
  this_00 = (PlanningUnit *)
            (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                      ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  sVar3 = PlanningUnit::GetHorizon(this_00);
  if (sVar5 == sVar3) {
    local_31 = 1;
  }
  plVar4 = (long *)(**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                             ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  (**(code **)(*plVar4 + 0x30))();
  local_58 = 1;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x8a2233);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd40,
             (size_type)in_stack_fffffffffffffd38,(value_type_conflict2 *)in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x8a2267);
  operator_new(0xe8);
  plVar4 = (long *)(**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                             ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  (**(code **)(*plVar4 + 0x30))();
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
            ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  PlanningUnitMADPDiscrete::GetNrActions((PlanningUnitMADPDiscrete *)0x8a22fb);
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
  boost::shared_ptr<BayesianGameIdenticalPayoff>::shared_ptr<BayesianGameIdenticalPayoff>
            ((shared_ptr<BayesianGameIdenticalPayoff> *)in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38);
  boost::shared_ptr<BayesianGameIdenticalPayoff>::operator->(&local_70);
  BayesianGameBase::SetProbability(in_stack_fffffffffffffd60,i,(double)in_stack_fffffffffffffd50);
  local_7c = 0;
  while( true ) {
    (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
              ((long)in_RDI + *(long *)(*in_RDI + -0x88));
    sVar3 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8a23da);
    if (sVar3 <= local_7c) break;
    local_88 = 0;
    local_8c = 0;
    while( true ) {
      (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      sVar3 = PlanningUnitMADPDiscrete::GetNrStates
                        (&in_stack_fffffffffffffd20->super_PlanningUnitMADPDiscrete);
      if (sVar3 <= local_8c) break;
      uVar6 = (**(code **)(*(long *)((long)&local_30->field_0x0 + *(long *)((long)*local_30 + -0xb8)
                                    ) + 0x48))
                        ((long)&local_30->field_0x0 + *(long *)((long)*local_30 + -0xb8),local_8c);
      (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      auVar8._0_8_ = PlanningUnitDecPOMDPDiscrete::GetReward
                               (in_stack_fffffffffffffd20,(Index)(in_stack_fffffffffffffd18 >> 0x20)
                                ,(Index)in_stack_fffffffffffffd18);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar6;
      auVar8._8_8_ = 0;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_88;
      auVar9 = vfmadd213sd_fma(auVar8,auVar10,auVar12);
      local_88 = auVar9._0_8_;
      local_8c = local_8c + 1;
    }
    local_98 = 0;
    if ((local_31 & 1) == 0) {
      local_98 = (**(code **)(*in_RDI + 0x78))(in_RDI,1,0,local_7c);
    }
    (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
              ((long)in_RDI + *(long *)(*in_RDI + -0x88));
    dVar7 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8a2633);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar7;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_88;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_98;
    auVar9 = vfmadd213sd_fma(auVar9,auVar11,auVar13);
    in_stack_fffffffffffffd38 = auVar9._0_8_;
    in_stack_fffffffffffffd40 =
         (BGIP_SolverBruteForceSearch<JointPolicyPureVector> *)
         boost::numeric::ublas::
         matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
         ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0x8a268f);
    (in_stack_fffffffffffffd40->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
    super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
    _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)in_stack_fffffffffffffd38;
    in_stack_fffffffffffffd30 =
         (PlanningUnitMADPDiscrete *)
         boost::shared_ptr<BayesianGameIdenticalPayoff>::operator->(&local_70);
    BayesianGameIdenticalPayoff::SetUtility
              ((BayesianGameIdenticalPayoff *)in_stack_fffffffffffffd20,
               (Index)(in_stack_fffffffffffffd18 >> 0x20),(Index)in_stack_fffffffffffffd18,
               4.4732278678011e-317);
    local_7c = local_7c + 1;
  }
  nrDesiredSolutions =
       (shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)&stack0xfffffffffffffe18;
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::
  shared_ptr<BayesianGameIdenticalPayoff>(nrDesiredSolutions,&local_70);
  BGIP_SolverBruteForceSearch<JointPolicyPureVector>::BGIP_SolverBruteForceSearch
            (in_stack_fffffffffffffd40,
             (shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)in_stack_fffffffffffffd38,
             (size_t)in_stack_fffffffffffffd30,(size_t)nrDesiredSolutions,
             (size_t)in_stack_fffffffffffffd20);
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x8a273c);
  BGIP_SolverBruteForceSearch<JointPolicyPureVector>::Solve
            ((BGIP_SolverBruteForceSearch<JointPolicyPureVector> *)
             bgs.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
             super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
             _m_timings_f);
  if (local_28 != (JointBeliefInterface *)0x0) {
    (**(code **)((long)*local_28 + 8))();
  }
  BGIP_SolverBruteForceSearch<JointPolicyPureVector>::~BGIP_SolverBruteForceSearch
            ((BGIP_SolverBruteForceSearch<JointPolicyPureVector> *)0x8a2789);
  boost::shared_ptr<BayesianGameIdenticalPayoff>::~shared_ptr
            ((shared_ptr<BayesianGameIdenticalPayoff> *)0x8a2796);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd30);
  return;
}

Assistant:

void QFunctionJAOHTree::ComputeQ()
{
    if(GetPU() == 0)
        throw E("QFunctionJAOHTree::ComputeQ - GetPU() returns 0; no PlanningUnit available!");

    size_t time_step = 0;
#if QFunctionJAOH_useIndices
#else    
    JointActionObservationHistoryTree* root = GetPU()->
        GetJointActionObservationHistoryTree(Globals::INITIAL_JAOHI);
#endif
    JointBeliefInterface* b0p = GetPU()->GetNewJointBeliefFromISD(); 
    JointBeliefInterface& b0 =  *b0p;
    
    bool last_t = false;
    if( (time_step + 1) == GetPU()->GetHorizon()) //unlikely, but possible
        last_t = true;

    if(DEBUG_QHEUR_COMP_TREE){cout << "QFunctionJAOHTree::Compute() called" << endl;}

    //in the first time_step t=0, there is no previous action and there is only
    //the empty observation action history.
    //Therefore we're going to construct a Bayesian game where there is only 1
    //type for each agent.
    vector<size_t> nrTypes = vector<size_t>(GetPU()->GetNrAgents(), 1);
    BGIP_sharedPtr bg_time_step=BGIP_sharedPtr(
        new BayesianGameIdenticalPayoff(GetPU()->GetNrAgents(), 
                                        GetPU()->GetNrActions(),
                                        nrTypes));

    size_t empty_jaohI = 0;
    bg_time_step->SetProbability(empty_jaohI, 1.0);
    for(Index newJAI=0; newJAI < GetPU()->GetNrJointActions(); newJAI++)
    {
        //calculate R(joah',newJA) - expected immediate reward for time_step
        double exp_imm_R = 0.0;
#if USE_BeliefIteratorGeneric
        BeliefIteratorGeneric it=b0.GetIterator();
        do exp_imm_R += it.GetProbability() *
            GetPU()->GetReward(it.GetStateIndex(), newJAI);
        while (it.Next());
#else
        for(Index sI=0; sI < GetPU()->GetNrStates(); sI++)
            exp_imm_R += (b0.Get(sI)) * GetPU()->GetReward(sI, newJAI);
#endif        
        //calculate Q(jaoh', newJA) =  R(joah',newJA) + exp. future R
        //  and the exp. future R = ComputeRecursively(t+1, root, newJA)
        double exp_fut_R = 0.0;
        if(!last_t)
#if QFunctionJAOH_useIndices
            exp_fut_R = ComputeRecursively( 1, Globals::INITIAL_JAOHI, newJAI);
#else    
            exp_fut_R = ComputeRecursively( 1, root, newJAI);
#endif
        double Q = exp_imm_R + GetPU()->GetDiscount() * exp_fut_R;
        _m_QValues(empty_jaohI,newJAI)=Q;
        bg_time_step->SetUtility(empty_jaohI, newJAI, Q);
    }//end for newJAI
    if(DEBUG_QHEUR_COMP_TREE)
    {
        cout << "QFunctionJAOHTree::ComputeQ() for..."<<endl<<
            " time_step=0  called, with ISD=";
        b0.Print();
        cout <<endl;
        bg_time_step->Print();
    }
    //solve this bayesian game
    BGIP_SolverBruteForceSearch<JointPolicyPureVector> bgs(bg_time_step);
    double v = bgs.Solve();
    if(DEBUG_QHEUR_COMP_TREE)
        cout << "QFunctionJAOHTree::ComputeQ() - Expected V(b0) = " << v << endl<< endl;
    delete b0p;
    return;
}